

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetKeyOwner(ImGuiKey key)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKeyOwnerData *pIVar3;
  ImGuiKey in_EDI;
  ImGuiID owner_id;
  ImGuiKeyOwnerData *owner_data;
  ImGuiContext *g;
  ImGuiID local_4;
  
  bVar2 = IsNamedKeyOrModKey(in_EDI);
  pIVar1 = GImGui;
  if (bVar2) {
    pIVar3 = GetKeyOwnerData(ImGuiKey_KeysData_OFFSET);
    local_4 = pIVar3->OwnerCurr;
    if (((((pIVar1->ActiveIdUsingAllKeyboardKeys & 1U) != 0) && (local_4 != pIVar1->ActiveId)) &&
        (local_4 != 0)) && ((0x1ff < (int)in_EDI && ((int)in_EDI < 0x269)))) {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

ImGuiID ImGui::GetKeyOwner(ImGuiKey key)
{
    if (!IsNamedKeyOrModKey(key))
        return ImGuiKeyOwner_None;

    ImGuiContext& g = *GImGui;
    ImGuiKeyOwnerData* owner_data = GetKeyOwnerData(key);
    ImGuiID owner_id = owner_data->OwnerCurr;

    if (g.ActiveIdUsingAllKeyboardKeys && owner_id != g.ActiveId && owner_id != ImGuiKeyOwner_Any)
        if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
            return ImGuiKeyOwner_None;

    return owner_id;
}